

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::getDataSink(MessageFederateManager *this,string_view name)

{
  bool bVar1;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> ept;
  shared_handle sharedEpt;
  char *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff78;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff80;
  string_view in_stack_ffffffffffffff88;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_50;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_38 [2];
  Endpoint *local_8;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff78);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(local_38);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
         *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  bVar1 = gmlc::containers::
          BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::operator==
                    (&local_50,
                     (BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> *)
                     &stack0xffffffffffffff70);
  if (bVar1) {
    local_8 = (Endpoint *)invalidEpt;
  }
  else {
    gmlc::containers::BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::
    operator->(&local_50);
    Endpoint::getType_abi_cxx11_((Endpoint *)0x2ba063);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_8 = gmlc::containers::
                BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::
                operator*(&local_50);
    }
    else {
      local_8 = (Endpoint *)invalidEptNC;
    }
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x2ba0d7);
  return local_8;
}

Assistant:

const Endpoint& MessageFederateManager::getDataSink(std::string_view name) const
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    if (ept == sharedEpt.end()) {
        return invalidEpt;
    }
    if (ept->getType() != "sink") {
        return invalidEptNC;
    }
    return *ept;
}